

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

void sx_os_sleep(int ms)

{
  undefined1 local_30 [8];
  timespec rem;
  timespec req;
  int ms_local;
  
  rem.tv_nsec = (long)ms / 1000;
  memset(local_30,0,0x10);
  nanosleep((timespec *)&rem.tv_nsec,(timespec *)local_30);
  return;
}

Assistant:

void sx_os_sleep(int ms)
{
#if SX_PLATFORM_WINDOWS
    Sleep(ms);
#else
    struct timespec req = { (time_t)ms / 1000, (long)((ms % 1000) * 1000000) };
    struct timespec rem = { 0, 0 };
    nanosleep(&req, &rem);
#endif    // SX_PLATFORM_
}